

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_unix.c
# Opt level: O0

TIFF * TIFFOpenExt(char *name,char *mode,TIFFOpenOptions *opts)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  TIFF *pTVar4;
  TIFF *tif;
  int fd;
  int m;
  TIFFOpenOptions *opts_local;
  char *mode_local;
  char *name_local;
  
  iVar1 = _TIFFgetMode(opts,(thandle_t)0x0,mode,"TIFFOpen");
  if (iVar1 == -1) {
    return (TIFF *)0x0;
  }
  iVar1 = open(name,iVar1,0x1b6);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if (0 < *piVar2) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      if (pcVar3 != (char *)0x0) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        _TIFFErrorEarly(opts,(thandle_t)0x0,"TIFFOpen","%s: %s",name,pcVar3);
        return (TIFF *)0x0;
      }
    }
    _TIFFErrorEarly(opts,(thandle_t)0x0,"TIFFOpen","%s: Cannot open",name);
    return (TIFF *)0x0;
  }
  pTVar4 = TIFFFdOpenExt(iVar1,name,mode,opts);
  if (pTVar4 == (TIFF *)0x0) {
    close(iVar1);
    return (TIFF *)0x0;
  }
  return pTVar4;
}

Assistant:

TIFF *TIFFOpenExt(const char *name, const char *mode, TIFFOpenOptions *opts)
{
    static const char module[] = "TIFFOpen";
    int m, fd;
    TIFF *tif;

    m = _TIFFgetMode(opts, NULL, mode, module);
    if (m == -1)
        return ((TIFF *)0);

/* for cygwin and mingw */
#ifdef O_BINARY
    m |= O_BINARY;
#endif

    fd = open(name, m, 0666);
    if (fd < 0)
    {
        if (errno > 0 && strerror(errno) != NULL)
        {
            _TIFFErrorEarly(opts, NULL, module, "%s: %s", name,
                            strerror(errno));
        }
        else
        {
            _TIFFErrorEarly(opts, NULL, module, "%s: Cannot open", name);
        }
        return ((TIFF *)0);
    }

    tif = TIFFFdOpenExt((int)fd, name, mode, opts);
    if (!tif)
        close(fd);
    return tif;
}